

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double orient4d(double *pa,double *pb,double *pc,double *pd,double *pe,double aheight,double bheight
               ,double cheight,double dheight,double eheight)

{
  undefined1 auVar1 [16];
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dStack_20;
  double dStack_10;
  
  dVar10 = aheight - eheight;
  dVar21 = cheight - eheight;
  auVar9._8_4_ = SUB84(dVar21,0);
  auVar9._0_8_ = dVar10;
  auVar9._12_4_ = (int)((ulong)dVar21 >> 0x20);
  dVar2 = bheight - eheight;
  auVar1._8_4_ = SUB84(dheight - eheight,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)(dheight - eheight) >> 0x20);
  dVar5 = *pe;
  dVar6 = pe[1];
  dVar19 = *pd - dVar5;
  dVar22 = pa[1] - dVar6;
  dVar23 = *pc - dVar5;
  dVar4 = pb[1] - dVar6;
  dVar7 = *pb - dVar5;
  dVar8 = pc[1] - dVar6;
  dVar5 = *pa - dVar5;
  dVar6 = pd[1] - dVar6;
  dVar16 = pe[2];
  dVar17 = pa[2] - dVar16;
  dVar18 = pc[2] - dVar16;
  dVar15 = pd[2] - dVar16;
  dVar16 = pb[2] - dVar16;
  dVar3 = dVar8 * dVar5 - dVar22 * dVar23;
  dVar12 = dVar22 * dVar19 - dVar6 * dVar5;
  dVar14 = dVar7 * dVar8 - dVar23 * dVar4;
  dVar11 = dVar6 * dVar23 - dVar8 * dVar19;
  dVar13 = dVar5 * dVar4 - dVar7 * dVar22;
  dVar20 = dVar6 * dVar7 - dVar4 * dVar19;
  dStack_10 = auVar1._8_8_;
  dVar12 = ((dVar18 * dVar13 + dVar17 * dVar14 + -dVar16 * dVar3) * dStack_10 -
           (dVar12 * dVar16 + dVar15 * dVar13 + dVar17 * dVar20) * dVar21) +
           ((dVar17 * dVar11 + dVar18 * dVar12 + dVar15 * dVar3) * dVar2 -
           (dVar14 * dVar15 + dVar16 * dVar11 + -dVar18 * dVar20) * dVar10);
  dVar14 = ABS(dVar8 * dVar19) + ABS(dVar6 * dVar23);
  dVar3 = ABS(dVar4 * dVar19) + ABS(dVar6 * dVar7);
  dVar16 = ABS(dVar16);
  dVar18 = ABS(dVar18);
  dVar21 = ABS(dVar7 * dVar8) + ABS(dVar23 * dVar4);
  dVar15 = ABS(dVar15);
  dVar19 = ABS(dVar6 * dVar5) + ABS(dVar22 * dVar19);
  dVar23 = ABS(dVar22 * dVar23) + ABS(dVar8 * dVar5);
  dVar17 = ABS(dVar17);
  dStack_20 = auVar9._8_8_;
  dVar22 = ABS(dVar5 * dVar4) + ABS(dVar7 * dVar22);
  dVar2 = ABS(dStack_10) * (dVar22 * dVar18 + dVar21 * dVar17 + dVar23 * dVar16) +
          ABS(dStack_20) * (dVar19 * dVar16 + dVar15 * dVar22 + dVar3 * dVar17) +
          ABS(dVar10) * (dVar21 * dVar15 + dVar14 * dVar16 + dVar3 * dVar18) +
          ABS(dVar2) * (dVar14 * dVar17 + dVar19 * dVar18 + dVar23 * dVar15);
  dVar16 = isperrboundA * dVar2;
  if ((dVar12 <= dVar16) && (-dVar12 <= dVar16)) {
    dVar16 = orient4dadapt(pa,pb,pc,pd,pe,aheight,bheight,cheight,dheight,eheight,dVar2);
    return dVar16;
  }
  return dVar12;
}

Assistant:

REAL orient4d(REAL* pa, REAL* pb, REAL* pc, REAL* pd, REAL* pe, 
              REAL aheight, REAL bheight, REAL cheight, REAL dheight, 
              REAL eheight)
{
 REAL aex, bex, cex, dex;
 REAL aey, bey, cey, dey;
 REAL aez, bez, cez, dez;
 REAL aexbey, bexaey, bexcey, cexbey, cexdey, dexcey, dexaey, aexdey;
 REAL aexcey, cexaey, bexdey, dexbey;
 REAL aeheight, beheight, ceheight, deheight;
 REAL ab, bc, cd, da, ac, bd;
 REAL abc, bcd, cda, dab;
 REAL aezplus, bezplus, cezplus, dezplus;
 REAL aexbeyplus, bexaeyplus, bexceyplus, cexbeyplus;
 REAL cexdeyplus, dexceyplus, dexaeyplus, aexdeyplus;
 REAL aexceyplus, cexaeyplus, bexdeyplus, dexbeyplus;
 REAL det;
 REAL permanent, errbound;


 aex = pa[0] - pe[0];
 bex = pb[0] - pe[0];
 cex = pc[0] - pe[0];
 dex = pd[0] - pe[0];
 aey = pa[1] - pe[1];
 bey = pb[1] - pe[1];
 cey = pc[1] - pe[1];
 dey = pd[1] - pe[1];
 aez = pa[2] - pe[2];
 bez = pb[2] - pe[2];
 cez = pc[2] - pe[2];
 dez = pd[2] - pe[2];
 aeheight = aheight - eheight;
 beheight = bheight - eheight;
 ceheight = cheight - eheight;
 deheight = dheight - eheight;

 aexbey = aex * bey;
 bexaey = bex * aey;
 ab = aexbey - bexaey;
 bexcey = bex * cey;
 cexbey = cex * bey;
 bc = bexcey - cexbey;
 cexdey = cex * dey;
 dexcey = dex * cey;
 cd = cexdey - dexcey;
 dexaey = dex * aey;
 aexdey = aex * dey;
 da = dexaey - aexdey;

 aexcey = aex * cey;
 cexaey = cex * aey;
 ac = aexcey - cexaey;
 bexdey = bex * dey;
 dexbey = dex * bey;
 bd = bexdey - dexbey;

 abc = aez * bc - bez * ac + cez * ab;
 bcd = bez * cd - cez * bd + dez * bc;
 cda = cez * da + dez * ac + aez * cd;
 dab = dez * ab + aez * bd + bez * da;

 det = (deheight * abc - ceheight * dab) + (beheight * cda - aeheight * bcd);

 aezplus = Absolute(aez);
 bezplus = Absolute(bez);
 cezplus = Absolute(cez);
 dezplus = Absolute(dez);
 aexbeyplus = Absolute(aexbey);
 bexaeyplus = Absolute(bexaey);
 bexceyplus = Absolute(bexcey);
 cexbeyplus = Absolute(cexbey);
 cexdeyplus = Absolute(cexdey);
 dexceyplus = Absolute(dexcey);
 dexaeyplus = Absolute(dexaey);
 aexdeyplus = Absolute(aexdey);
 aexceyplus = Absolute(aexcey);
 cexaeyplus = Absolute(cexaey);
 bexdeyplus = Absolute(bexdey);
 dexbeyplus = Absolute(dexbey);
 permanent = ((cexdeyplus + dexceyplus) * bezplus
              + (dexbeyplus + bexdeyplus) * cezplus
              + (bexceyplus + cexbeyplus) * dezplus)
           * Absolute(aeheight)
           + ((dexaeyplus + aexdeyplus) * cezplus
              + (aexceyplus + cexaeyplus) * dezplus
              + (cexdeyplus + dexceyplus) * aezplus)
           * Absolute(beheight)
           + ((aexbeyplus + bexaeyplus) * dezplus
              + (bexdeyplus + dexbeyplus) * aezplus
              + (dexaeyplus + aexdeyplus) * bezplus)
           * Absolute(ceheight)
           + ((bexceyplus + cexbeyplus) * aezplus
              + (cexaeyplus + aexceyplus) * bezplus
              + (aexbeyplus + bexaeyplus) * cezplus)
           * Absolute(deheight);
 errbound = isperrboundA * permanent;
 if ((det > errbound) || (-det > errbound)) {
   return det;
 }

 return orient4dadapt(pa, pb, pc, pd, pe,
                      aheight, bheight, cheight, dheight, eheight, permanent);
}